

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchclient.hpp
# Opt level: O3

BatchResponse * __thiscall
jsonrpccxx::BatchClient::BatchCall
          (BatchResponse *__return_storage_ptr__,BatchClient *this,BatchRequest *request)

{
  IClientConnector *pIVar1;
  JsonRpcException *this_00;
  json response;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string_t local_78;
  json local_58;
  _Any_data local_48;
  code *local_38;
  undefined8 uStack_30;
  
  pIVar1 = (this->super_JsonRpcClient).connector;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::dump(&local_78,&request->call,-1,' ',false,strict);
  (*pIVar1->_vptr_IClientConnector[2])(&local_98,pIVar1,&local_78);
  local_38 = (code *)0x0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<std::__cxx11::string>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_58,&local_98,(parser_callback_t *)&local_48,true,false);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_58.m_type == array) {
    BatchResponse::BatchResponse(__return_storage_ptr__,&local_58);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_58);
    return __return_storage_ptr__;
  }
  this_00 = (JsonRpcException *)__cxa_allocate_exception(0x60);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"invalid JSON response from server: expected array","");
  JsonRpcException::JsonRpcException(this_00,-0x7fbc,&local_98);
  __cxa_throw(this_00,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
}

Assistant:

BatchResponse BatchCall(const BatchRequest &request) {
      try {
        json response = json::parse(connector.Send(request.Build().dump()));
        if (!response.is_array()) {
          throw JsonRpcException(parse_error, std::string("invalid JSON response from server: expected array"));
        }
        return BatchResponse(std::move(response));
      } catch (json::parse_error &e) {
        throw JsonRpcException(parse_error, std::string("invalid JSON response from server: ") + e.what());
      }
    }